

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store_in_memory_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::TrustStoreInMemoryTest_DistrustBySPKIOverridesTrust_Test::TestBody
          (TrustStoreInMemoryTest_DistrustBySPKIOverridesTrust_Test *this)

{
  element_type *peVar1;
  uchar *puVar2;
  char *message;
  AssertionResult gtest_ar;
  CertificateTrust trust;
  TrustStoreInMemory in_memory;
  internal local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  string local_100;
  string local_e0;
  shared_ptr<const_bssl::ParsedCertificate> local_c0;
  CertificateTrust local_b0;
  string local_a8;
  CertificateTrust local_88;
  TrustStoreInMemory local_80;
  
  TrustStoreInMemory::TrustStoreInMemory(&local_80);
  local_c0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_TrustStoreInMemoryTest).newroot_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (this->super_TrustStoreInMemoryTest).newroot_.
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (local_c0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_c0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_c0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  TrustStoreInMemory::AddTrustAnchor(&local_80,&local_c0);
  if (local_c0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar1 = (this->super_TrustStoreInMemoryTest).newroot_.
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar2 = (peVar1->tbs_).spki_tlv.data_.data_;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,puVar2,puVar2 + (peVar1->tbs_).spki_tlv.data_.size_);
  TrustStoreInMemory::AddDistrustedCertificateBySPKI(&local_80,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_b0 = TrustStoreInMemory::GetTrust
                       (&local_80,
                        (this->super_TrustStoreInMemoryTest).newroot_.
                        super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
  local_88.type = DISTRUSTED;
  local_88.enforce_anchor_expiry = false;
  local_88.enforce_anchor_constraints = false;
  local_88.require_anchor_basic_constraints = false;
  local_88.require_leaf_selfsigned = false;
  CertificateTrust::ToDebugString_abi_cxx11_(&local_100,&local_88);
  CertificateTrust::ToDebugString_abi_cxx11_(&local_e0,&local_b0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_110,"CertificateTrust::ForDistrusted().ToDebugString()","trust.ToDebugString()",
             &local_100,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
               ,0x6c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if ((long *)local_100._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_100._M_dataplus._M_p + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  TrustStoreInMemory::~TrustStoreInMemory(&local_80);
  return;
}

Assistant:

TEST_F(TrustStoreInMemoryTest, DistrustBySPKIOverridesTrust) {
  TrustStoreInMemory in_memory;
  in_memory.AddTrustAnchor(newroot_);
  in_memory.AddDistrustedCertificateBySPKI(
      std::string(BytesAsStringView(newroot_->tbs().spki_tlv)));

  // newroot_ is distrusted.
  CertificateTrust trust = in_memory.GetTrust(newroot_.get());
  EXPECT_EQ(CertificateTrust::ForDistrusted().ToDebugString(),
            trust.ToDebugString());
}